

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::BVHNIntersector1<4,_257,_true,_embree::avx::VirtualCurveIntersector1>::occluded
               (Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  bool bVar6;
  char cVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  NodeRef *pNVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  undefined4 uVar18;
  ulong unaff_R15;
  vint4 ai;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  vint4 ai_1;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  vint4 bi_1;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  vint4 bi_3;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 bi;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  vfloat4 a0;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar44;
  float fVar45;
  float fVar49;
  float fVar50;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar51;
  float fVar52;
  float fVar56;
  float fVar57;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar58;
  float fVar59;
  float fVar63;
  float fVar64;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  Precalculations pre;
  NodeRef stack [244];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      aVar5 = (ray->dir).field_0.field_1;
      auVar29 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
      auVar30 = vrsqrtss_avx(auVar29,auVar29);
      fVar41 = auVar30._0_4_;
      pre.depth_scale = fVar41 * 1.5 - auVar29._0_4_ * 0.5 * fVar41 * fVar41 * fVar41;
      fVar41 = (ray->dir).field_0.m128[0];
      fVar2 = (ray->dir).field_0.m128[1];
      auVar34 = vshufps_avx(ZEXT416((uint)pre.depth_scale),ZEXT416((uint)pre.depth_scale),0);
      auVar42._0_4_ = aVar5.x * auVar34._0_4_;
      auVar42._4_4_ = aVar5.y * auVar34._4_4_;
      auVar42._8_4_ = aVar5.z * auVar34._8_4_;
      auVar42._12_4_ = aVar5.field_3.w * auVar34._12_4_;
      auVar30 = vshufpd_avx(auVar42,auVar42,1);
      auVar29 = vmovshdup_avx(auVar42);
      auVar66._8_4_ = 0x80000000;
      auVar66._0_8_ = 0x8000000080000000;
      auVar66._12_4_ = 0x80000000;
      auVar43._12_4_ = 0;
      auVar43._0_12_ = ZEXT812(0);
      auVar43 = auVar43 << 0x20;
      auVar46 = vunpckhps_avx(auVar42,auVar43);
      auVar37 = vshufps_avx(auVar46,ZEXT416(auVar29._0_4_ ^ 0x80000000),0x41);
      auVar46._0_8_ = auVar30._0_8_ ^ 0x8000000080000000;
      auVar46._8_8_ = auVar30._8_8_ ^ auVar66._8_8_;
      auVar46 = vinsertps_avx(auVar46,auVar42,0x2a);
      auVar29 = vdpps_avx(auVar37,auVar37,0x7f);
      auVar30 = vdpps_avx(auVar46,auVar46,0x7f);
      auVar29 = vcmpps_avx(auVar30,auVar29,1);
      auVar29 = vshufps_avx(auVar29,auVar29,0);
      auVar29 = vblendvps_avx(auVar46,auVar37,auVar29);
      auVar30 = vdpps_avx(auVar29,auVar29,0x7f);
      auVar46 = vrsqrtss_avx(auVar30,auVar30);
      fVar44 = auVar46._0_4_;
      auVar30 = ZEXT416((uint)(fVar44 * 1.5 - auVar30._0_4_ * 0.5 * fVar44 * fVar44 * fVar44));
      auVar30 = vshufps_avx(auVar30,auVar30,0);
      auVar47._0_4_ = auVar29._0_4_ * auVar30._0_4_;
      auVar47._4_4_ = auVar29._4_4_ * auVar30._4_4_;
      auVar47._8_4_ = auVar29._8_4_ * auVar30._8_4_;
      auVar47._12_4_ = auVar29._12_4_ * auVar30._12_4_;
      auVar29 = vshufps_avx(auVar47,auVar47,0xc9);
      auVar30 = vshufps_avx(auVar42,auVar42,0xc9);
      auVar60._0_4_ = auVar30._0_4_ * auVar47._0_4_;
      auVar60._4_4_ = auVar30._4_4_ * auVar47._4_4_;
      auVar60._8_4_ = auVar30._8_4_ * auVar47._8_4_;
      auVar60._12_4_ = auVar30._12_4_ * auVar47._12_4_;
      auVar53._0_4_ = auVar29._0_4_ * auVar42._0_4_;
      auVar53._4_4_ = auVar29._4_4_ * auVar42._4_4_;
      auVar53._8_4_ = auVar29._8_4_ * auVar42._8_4_;
      auVar53._12_4_ = auVar29._12_4_ * auVar42._12_4_;
      auVar29 = vsubps_avx(auVar53,auVar60);
      auVar46 = vshufps_avx(auVar29,auVar29,0xc9);
      auVar29 = vdpps_avx(auVar46,auVar46,0x7f);
      auVar30 = vrsqrtss_avx(auVar29,auVar29);
      fVar44 = auVar30._0_4_;
      auVar29 = ZEXT416((uint)(fVar44 * 1.5 - fVar44 * fVar44 * fVar44 * auVar29._0_4_ * 0.5));
      auVar29 = vshufps_avx(auVar29,auVar29,0);
      auVar30._0_4_ = auVar46._0_4_ * auVar29._0_4_;
      auVar30._4_4_ = auVar46._4_4_ * auVar29._4_4_;
      auVar30._8_4_ = auVar46._8_4_ * auVar29._8_4_;
      auVar30._12_4_ = auVar46._12_4_ * auVar29._12_4_;
      auVar29._0_4_ = auVar34._0_4_ * auVar42._0_4_;
      auVar29._4_4_ = auVar34._4_4_ * auVar42._4_4_;
      auVar29._8_4_ = auVar34._8_4_ * auVar42._8_4_;
      auVar29._12_4_ = auVar34._12_4_ * auVar42._12_4_;
      auVar46 = vunpcklps_avx(auVar47,auVar29);
      auVar29 = vunpckhps_avx(auVar47,auVar29);
      auVar34 = vunpcklps_avx(auVar30,auVar43);
      auVar30 = vunpckhps_avx(auVar30,auVar43);
      pre.ray_space.vz.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar29,auVar30);
      pre.ray_space.vx.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar46,auVar34);
      pre.ray_space.vy.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar46,auVar34);
      pNVar14 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar46 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar34._8_4_ = 0x7fffffff;
      auVar34._0_8_ = 0x7fffffff7fffffff;
      auVar34._12_4_ = 0x7fffffff;
      auVar29 = vandps_avx((undefined1  [16])aVar5,auVar34);
      auVar37._8_4_ = 0x219392ef;
      auVar37._0_8_ = 0x219392ef219392ef;
      auVar37._12_4_ = 0x219392ef;
      auVar29 = vcmpps_avx(auVar29,auVar37,1);
      auVar38._8_4_ = 0x3f800000;
      auVar38._0_8_ = &DAT_3f8000003f800000;
      auVar38._12_4_ = 0x3f800000;
      auVar30 = vdivps_avx(auVar38,(undefined1  [16])aVar5);
      auVar39._8_4_ = 0x5d5e0b6b;
      auVar39._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar39._12_4_ = 0x5d5e0b6b;
      auVar29 = vblendvps_avx(auVar30,auVar39,auVar29);
      auVar35._0_4_ = auVar29._0_4_ * 0.99999964;
      auVar35._4_4_ = auVar29._4_4_ * 0.99999964;
      auVar35._8_4_ = auVar29._8_4_ * 0.99999964;
      auVar35._12_4_ = auVar29._12_4_ * 0.99999964;
      auVar26._0_4_ = auVar29._0_4_ * 1.0000004;
      auVar26._4_4_ = auVar29._4_4_ * 1.0000004;
      auVar26._8_4_ = auVar29._8_4_ * 1.0000004;
      auVar26._12_4_ = auVar29._12_4_ * 1.0000004;
      auVar34 = vshufps_avx(auVar35,auVar35,0);
      auVar29 = vmovshdup_avx(auVar35);
      auVar37 = vshufps_avx(auVar35,auVar35,0x55);
      uVar15 = (ulong)(auVar35._0_4_ < 0.0) * 0x10;
      auVar30 = vshufpd_avx(auVar35,auVar35,1);
      auVar43 = vshufps_avx(auVar35,auVar35,0xaa);
      uVar17 = (ulong)(auVar29._0_4_ < 0.0) << 4 | 0x20;
      auVar29 = vshufps_avx(auVar26,auVar26,0);
      auVar35 = vshufps_avx(auVar26,auVar26,0x55);
      auVar26 = vshufps_avx(auVar26,auVar26,0xaa);
      uVar16 = (ulong)(auVar30._0_4_ < 0.0) << 4 | 0x40;
      auVar30 = vshufps_avx(auVar46,auVar46,0);
      auVar46 = vshufps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0);
      fVar1 = (ray->dir).field_0.m128[2];
      fVar44 = (ray->org).field_0.m128[0];
      auVar67._4_4_ = fVar44;
      auVar67._0_4_ = fVar44;
      auVar67._8_4_ = fVar44;
      auVar67._12_4_ = fVar44;
      fVar3 = (ray->org).field_0.m128[1];
      auVar69._4_4_ = fVar3;
      auVar69._0_4_ = fVar3;
      auVar69._8_4_ = fVar3;
      auVar69._12_4_ = fVar3;
      fVar4 = (ray->org).field_0.m128[2];
      auVar71._4_4_ = fVar4;
      auVar71._0_4_ = fVar4;
      auVar71._8_4_ = fVar4;
      auVar71._12_4_ = fVar4;
      do {
        if (pNVar14 == stack) {
          return;
        }
        uVar10 = pNVar14[-1].ptr;
        pNVar14 = pNVar14 + -1;
        do {
          if ((uVar10 & 0xf) == 0) {
            auVar38 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar15),auVar67);
            auVar19._0_4_ = auVar34._0_4_ * auVar38._0_4_;
            auVar19._4_4_ = auVar34._4_4_ * auVar38._4_4_;
            auVar19._8_4_ = auVar34._8_4_ * auVar38._8_4_;
            auVar19._12_4_ = auVar34._12_4_ * auVar38._12_4_;
            auVar38 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar17),auVar69);
            auVar22._0_4_ = auVar37._0_4_ * auVar38._0_4_;
            auVar22._4_4_ = auVar37._4_4_ * auVar38._4_4_;
            auVar22._8_4_ = auVar37._8_4_ * auVar38._8_4_;
            auVar22._12_4_ = auVar37._12_4_ * auVar38._12_4_;
            auVar38 = vmaxps_avx(auVar19,auVar22);
            auVar39 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + uVar16),auVar71);
            auVar23._0_4_ = auVar43._0_4_ * auVar39._0_4_;
            auVar23._4_4_ = auVar43._4_4_ * auVar39._4_4_;
            auVar23._8_4_ = auVar43._8_4_ * auVar39._8_4_;
            auVar23._12_4_ = auVar43._12_4_ * auVar39._12_4_;
            auVar39 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + (uVar15 ^ 0x10)),auVar67);
            auVar27._0_4_ = auVar29._0_4_ * auVar39._0_4_;
            auVar27._4_4_ = auVar29._4_4_ * auVar39._4_4_;
            auVar27._8_4_ = auVar29._8_4_ * auVar39._8_4_;
            auVar27._12_4_ = auVar29._12_4_ * auVar39._12_4_;
            auVar39 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + (uVar17 ^ 0x10)),auVar69);
            auVar31._0_4_ = auVar35._0_4_ * auVar39._0_4_;
            auVar31._4_4_ = auVar35._4_4_ * auVar39._4_4_;
            auVar31._8_4_ = auVar35._8_4_ * auVar39._8_4_;
            auVar31._12_4_ = auVar35._12_4_ * auVar39._12_4_;
            auVar42 = vminps_avx(auVar27,auVar31);
            auVar39 = vsubps_avx(*(undefined1 (*) [16])(uVar10 + 0x20 + (uVar16 ^ 0x10)),auVar71);
            auVar32._0_4_ = auVar26._0_4_ * auVar39._0_4_;
            auVar32._4_4_ = auVar26._4_4_ * auVar39._4_4_;
            auVar32._8_4_ = auVar26._8_4_ * auVar39._8_4_;
            auVar32._12_4_ = auVar26._12_4_ * auVar39._12_4_;
            auVar39 = vmaxps_avx(auVar23,auVar30);
            auVar38 = vmaxps_avx(auVar38,auVar39);
            auVar39 = vminps_avx(auVar32,auVar46);
            auVar39 = vminps_avx(auVar42,auVar39);
            auVar38 = vcmpps_avx(auVar38,auVar39,2);
LAB_002d5018:
            uVar18 = vmovmskps_avx(auVar38);
            unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar18);
            bVar6 = true;
          }
          else {
            if ((int)(uVar10 & 0xf) == 2) {
              uVar9 = uVar10 & 0xfffffffffffffff0;
              auVar61._0_4_ =
                   fVar2 * *(float *)(uVar9 + 0x50) + fVar1 * *(float *)(uVar9 + 0x80) +
                   fVar41 * *(float *)(uVar9 + 0x20);
              auVar61._4_4_ =
                   fVar2 * *(float *)(uVar9 + 0x54) + fVar1 * *(float *)(uVar9 + 0x84) +
                   fVar41 * *(float *)(uVar9 + 0x24);
              auVar61._8_4_ =
                   fVar2 * *(float *)(uVar9 + 0x58) + fVar1 * *(float *)(uVar9 + 0x88) +
                   fVar41 * *(float *)(uVar9 + 0x28);
              auVar61._12_4_ =
                   fVar2 * *(float *)(uVar9 + 0x5c) + fVar1 * *(float *)(uVar9 + 0x8c) +
                   fVar41 * *(float *)(uVar9 + 0x2c);
              auVar48._0_4_ =
                   fVar1 * *(float *)(uVar9 + 0x90) + fVar2 * *(float *)(uVar9 + 0x60) +
                   fVar41 * *(float *)(uVar9 + 0x30);
              auVar48._4_4_ =
                   fVar1 * *(float *)(uVar9 + 0x94) + fVar2 * *(float *)(uVar9 + 100) +
                   fVar41 * *(float *)(uVar9 + 0x34);
              auVar48._8_4_ =
                   fVar1 * *(float *)(uVar9 + 0x98) + fVar2 * *(float *)(uVar9 + 0x68) +
                   fVar41 * *(float *)(uVar9 + 0x38);
              auVar48._12_4_ =
                   fVar1 * *(float *)(uVar9 + 0x9c) + fVar2 * *(float *)(uVar9 + 0x6c) +
                   fVar41 * *(float *)(uVar9 + 0x3c);
              auVar54._0_4_ =
                   fVar1 * *(float *)(uVar9 + 0xa0) + fVar2 * *(float *)(uVar9 + 0x70) +
                   fVar41 * *(float *)(uVar9 + 0x40);
              auVar54._4_4_ =
                   fVar1 * *(float *)(uVar9 + 0xa4) + fVar2 * *(float *)(uVar9 + 0x74) +
                   fVar41 * *(float *)(uVar9 + 0x44);
              auVar54._8_4_ =
                   fVar1 * *(float *)(uVar9 + 0xa8) + fVar2 * *(float *)(uVar9 + 0x78) +
                   fVar41 * *(float *)(uVar9 + 0x48);
              auVar54._12_4_ =
                   fVar1 * *(float *)(uVar9 + 0xac) + fVar2 * *(float *)(uVar9 + 0x7c) +
                   fVar41 * *(float *)(uVar9 + 0x4c);
              auVar70._8_4_ = 0x7fffffff;
              auVar70._0_8_ = 0x7fffffff7fffffff;
              auVar70._12_4_ = 0x7fffffff;
              auVar38 = vandps_avx(auVar61,auVar70);
              auVar72._8_4_ = 0x219392ef;
              auVar72._0_8_ = 0x219392ef219392ef;
              auVar72._12_4_ = 0x219392ef;
              auVar38 = vcmpps_avx(auVar38,auVar72,1);
              auVar39 = vblendvps_avx(auVar61,auVar72,auVar38);
              auVar38 = vandps_avx(auVar48,auVar70);
              auVar38 = vcmpps_avx(auVar38,auVar72,1);
              auVar42 = vblendvps_avx(auVar48,auVar72,auVar38);
              auVar38 = vandps_avx(auVar54,auVar70);
              auVar38 = vcmpps_avx(auVar38,auVar72,1);
              auVar38 = vblendvps_avx(auVar54,auVar72,auVar38);
              auVar47 = vrcpps_avx(auVar39);
              fVar45 = auVar47._0_4_;
              auVar55._0_4_ = fVar45 * auVar39._0_4_;
              fVar49 = auVar47._4_4_;
              auVar55._4_4_ = fVar49 * auVar39._4_4_;
              fVar50 = auVar47._8_4_;
              auVar55._8_4_ = fVar50 * auVar39._8_4_;
              fVar51 = auVar47._12_4_;
              auVar55._12_4_ = fVar51 * auVar39._12_4_;
              auVar73._8_4_ = 0x3f800000;
              auVar73._0_8_ = &DAT_3f8000003f800000;
              auVar73._12_4_ = 0x3f800000;
              auVar39 = vsubps_avx(auVar73,auVar55);
              fVar45 = fVar45 + fVar45 * auVar39._0_4_;
              fVar49 = fVar49 + fVar49 * auVar39._4_4_;
              fVar50 = fVar50 + fVar50 * auVar39._8_4_;
              fVar51 = fVar51 + fVar51 * auVar39._12_4_;
              auVar39 = vrcpps_avx(auVar42);
              fVar52 = auVar39._0_4_;
              auVar62._0_4_ = fVar52 * auVar42._0_4_;
              fVar56 = auVar39._4_4_;
              auVar62._4_4_ = fVar56 * auVar42._4_4_;
              fVar57 = auVar39._8_4_;
              auVar62._8_4_ = fVar57 * auVar42._8_4_;
              fVar58 = auVar39._12_4_;
              auVar62._12_4_ = fVar58 * auVar42._12_4_;
              auVar39 = vsubps_avx(auVar73,auVar62);
              fVar52 = fVar52 + fVar52 * auVar39._0_4_;
              fVar56 = fVar56 + fVar56 * auVar39._4_4_;
              fVar57 = fVar57 + fVar57 * auVar39._8_4_;
              fVar58 = fVar58 + fVar58 * auVar39._12_4_;
              auVar39 = vrcpps_avx(auVar38);
              fVar59 = auVar39._0_4_;
              auVar68._0_4_ = fVar59 * auVar38._0_4_;
              fVar63 = auVar39._4_4_;
              auVar68._4_4_ = fVar63 * auVar38._4_4_;
              fVar64 = auVar39._8_4_;
              auVar68._8_4_ = fVar64 * auVar38._8_4_;
              fVar65 = auVar39._12_4_;
              auVar68._12_4_ = fVar65 * auVar38._12_4_;
              auVar38 = vsubps_avx(auVar73,auVar68);
              fVar59 = fVar59 + fVar59 * auVar38._0_4_;
              fVar63 = fVar63 + fVar63 * auVar38._4_4_;
              fVar64 = fVar64 + fVar64 * auVar38._8_4_;
              fVar65 = fVar65 + fVar65 * auVar38._12_4_;
              auVar28._0_4_ =
                   (fVar44 * *(float *)(uVar9 + 0x20) +
                   fVar3 * *(float *)(uVar9 + 0x50) +
                   fVar4 * *(float *)(uVar9 + 0x80) + *(float *)(uVar9 + 0xb0)) * -fVar45;
              auVar28._4_4_ =
                   (fVar44 * *(float *)(uVar9 + 0x24) +
                   fVar3 * *(float *)(uVar9 + 0x54) +
                   fVar4 * *(float *)(uVar9 + 0x84) + *(float *)(uVar9 + 0xb4)) * -fVar49;
              auVar28._8_4_ =
                   (fVar44 * *(float *)(uVar9 + 0x28) +
                   fVar3 * *(float *)(uVar9 + 0x58) +
                   fVar4 * *(float *)(uVar9 + 0x88) + *(float *)(uVar9 + 0xb8)) * -fVar50;
              auVar28._12_4_ =
                   (fVar44 * *(float *)(uVar9 + 0x2c) +
                   fVar3 * *(float *)(uVar9 + 0x5c) +
                   fVar4 * *(float *)(uVar9 + 0x8c) + *(float *)(uVar9 + 0xbc)) * -fVar51;
              auVar24._0_4_ =
                   (fVar44 * *(float *)(uVar9 + 0x30) +
                   fVar3 * *(float *)(uVar9 + 0x60) +
                   fVar4 * *(float *)(uVar9 + 0x90) + *(float *)(uVar9 + 0xc0)) * -fVar52;
              auVar24._4_4_ =
                   (fVar44 * *(float *)(uVar9 + 0x34) +
                   fVar3 * *(float *)(uVar9 + 100) +
                   fVar4 * *(float *)(uVar9 + 0x94) + *(float *)(uVar9 + 0xc4)) * -fVar56;
              auVar24._8_4_ =
                   (fVar44 * *(float *)(uVar9 + 0x38) +
                   fVar3 * *(float *)(uVar9 + 0x68) +
                   fVar4 * *(float *)(uVar9 + 0x98) + *(float *)(uVar9 + 200)) * -fVar57;
              auVar24._12_4_ =
                   (fVar44 * *(float *)(uVar9 + 0x3c) +
                   fVar3 * *(float *)(uVar9 + 0x6c) +
                   fVar4 * *(float *)(uVar9 + 0x9c) + *(float *)(uVar9 + 0xcc)) * -fVar58;
              auVar20._0_4_ =
                   (fVar44 * *(float *)(uVar9 + 0x40) +
                   fVar3 * *(float *)(uVar9 + 0x70) +
                   fVar4 * *(float *)(uVar9 + 0xa0) + *(float *)(uVar9 + 0xd0)) * -fVar59;
              auVar20._4_4_ =
                   (fVar44 * *(float *)(uVar9 + 0x44) +
                   fVar3 * *(float *)(uVar9 + 0x74) +
                   fVar4 * *(float *)(uVar9 + 0xa4) + *(float *)(uVar9 + 0xd4)) * -fVar63;
              auVar20._8_4_ =
                   (fVar44 * *(float *)(uVar9 + 0x48) +
                   fVar3 * *(float *)(uVar9 + 0x78) +
                   fVar4 * *(float *)(uVar9 + 0xa8) + *(float *)(uVar9 + 0xd8)) * -fVar64;
              auVar20._12_4_ =
                   (fVar44 * *(float *)(uVar9 + 0x4c) +
                   fVar3 * *(float *)(uVar9 + 0x7c) +
                   fVar4 * *(float *)(uVar9 + 0xac) + *(float *)(uVar9 + 0xdc)) * -fVar65;
              auVar33._0_4_ = fVar45 + auVar28._0_4_;
              auVar33._4_4_ = fVar49 + auVar28._4_4_;
              auVar33._8_4_ = fVar50 + auVar28._8_4_;
              auVar33._12_4_ = fVar51 + auVar28._12_4_;
              auVar36._0_4_ = fVar52 + auVar24._0_4_;
              auVar36._4_4_ = fVar56 + auVar24._4_4_;
              auVar36._8_4_ = fVar57 + auVar24._8_4_;
              auVar36._12_4_ = fVar58 + auVar24._12_4_;
              auVar40._0_4_ = fVar59 + auVar20._0_4_;
              auVar40._4_4_ = fVar63 + auVar20._4_4_;
              auVar40._8_4_ = fVar64 + auVar20._8_4_;
              auVar40._12_4_ = fVar65 + auVar20._12_4_;
              auVar38 = vpminsd_avx(auVar24,auVar36);
              auVar39 = vpminsd_avx(auVar20,auVar40);
              auVar38 = vmaxps_avx(auVar38,auVar39);
              auVar53 = vpminsd_avx(auVar28,auVar33);
              auVar47 = vpmaxsd_avx(auVar28,auVar33);
              auVar39 = vpmaxsd_avx(auVar24,auVar36);
              auVar42 = vpmaxsd_avx(auVar20,auVar40);
              auVar42 = vminps_avx(auVar39,auVar42);
              auVar39 = vmaxps_avx(auVar30,auVar53);
              auVar38 = vmaxps_avx(auVar39,auVar38);
              auVar39 = vminps_avx(auVar46,auVar47);
              auVar39 = vminps_avx(auVar39,auVar42);
              auVar25._0_4_ = auVar38._0_4_ * 0.99999964;
              auVar25._4_4_ = auVar38._4_4_ * 0.99999964;
              auVar25._8_4_ = auVar38._8_4_ * 0.99999964;
              auVar25._12_4_ = auVar38._12_4_ * 0.99999964;
              auVar21._0_4_ = auVar39._0_4_ * 1.0000004;
              auVar21._4_4_ = auVar39._4_4_ * 1.0000004;
              auVar21._8_4_ = auVar39._8_4_ * 1.0000004;
              auVar21._12_4_ = auVar39._12_4_ * 1.0000004;
              auVar38 = vcmpps_avx(auVar25,auVar21,2);
              goto LAB_002d5018;
            }
            bVar6 = false;
          }
          if (bVar6) {
            if (unaff_R15 == 0) {
              iVar11 = 4;
            }
            else {
              uVar9 = uVar10 & 0xfffffffffffffff0;
              lVar13 = 0;
              if (unaff_R15 != 0) {
                for (; (unaff_R15 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                }
              }
              iVar11 = 0;
              uVar10 = *(ulong *)(uVar9 + lVar13 * 8);
              uVar12 = unaff_R15 - 1 & unaff_R15;
              if (uVar12 != 0) {
                pNVar14->ptr = uVar10;
                lVar13 = 0;
                if (uVar12 != 0) {
                  for (; (uVar12 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                  }
                }
                uVar8 = uVar12 - 1;
                while( true ) {
                  pNVar14 = pNVar14 + 1;
                  uVar10 = *(ulong *)(uVar9 + lVar13 * 8);
                  uVar8 = uVar8 & uVar12;
                  if (uVar8 == 0) break;
                  pNVar14->ptr = uVar10;
                  lVar13 = 0;
                  if (uVar8 != 0) {
                    for (; (uVar8 >> lVar13 & 1) == 0; lVar13 = lVar13 + 1) {
                    }
                  }
                  uVar12 = uVar8 - 1;
                }
              }
            }
          }
          else {
            iVar11 = 6;
          }
        } while (iVar11 == 0);
        if (iVar11 == 6) {
          cVar7 = (**(code **)((long)This->leafIntersector +
                              (ulong)*(byte *)(uVar10 & 0xfffffffffffffff0) * 0x40 + 8))
                            (&pre,ray,context);
          iVar11 = 0;
          if (cVar7 != '\0') {
            ray->tfar = -INFINITY;
            iVar11 = 3;
          }
        }
      } while (iVar11 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }